

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall
HFactor::btranCall(HFactor *this,HVector *vector,double expected_density,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  FactorTimer factor_timer;
  
  iVar1 = vector->count;
  FactorTimer::start(&factor_timer,0x19,factor_timer_clock_pointer);
  btranU(this,vector,expected_density,factor_timer_clock_pointer);
  btranL(this,vector,expected_density,factor_timer_clock_pointer);
  if (-1 < iVar1) {
    HVectorBase<double>::reIndex(vector);
  }
  FactorTimer::stop(&factor_timer,0x19,factor_timer_clock_pointer);
  return;
}

Assistant:

void HFactor::btranCall(HVector& vector, const double expected_density,
                        HighsTimerClock* factor_timer_clock_pointer) const {
  const bool use_indices = vector.count >= 0;
  FactorTimer factor_timer;
  factor_timer.start(FactorBtran, factor_timer_clock_pointer);
  btranU(vector, expected_density, factor_timer_clock_pointer);
  btranL(vector, expected_density, factor_timer_clock_pointer);
  // Possibly find the indices in order
  if (use_indices) vector.reIndex();
  factor_timer.stop(FactorBtran, factor_timer_clock_pointer);
}